

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O0

void __thiscall
icu_63::OlsonTimeZone::getOffsetFromLocal
          (OlsonTimeZone *this,UDate date,int32_t nonExistingTimeOpt,int32_t duplicatedTimeOpt,
          int32_t *rawoff,int32_t *dstoff,UErrorCode *ec)

{
  UBool UVar1;
  UErrorCode *ec_local;
  int32_t *dstoff_local;
  int32_t *rawoff_local;
  int32_t duplicatedTimeOpt_local;
  int32_t nonExistingTimeOpt_local;
  UDate date_local;
  OlsonTimeZone *this_local;
  
  UVar1 = ::U_FAILURE(*ec);
  if (UVar1 == '\0') {
    if ((this->finalZone == (SimpleTimeZone *)0x0) || (date < this->finalStartMillis)) {
      getHistoricalOffset(this,date,'\x01',nonExistingTimeOpt,duplicatedTimeOpt,rawoff,dstoff);
    }
    else {
      (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0x14])
                (date,this->finalZone,(ulong)(uint)nonExistingTimeOpt,(ulong)(uint)duplicatedTimeOpt
                 ,rawoff,dstoff,ec);
    }
  }
  return;
}

Assistant:

void
OlsonTimeZone::getOffsetFromLocal(UDate date, int32_t nonExistingTimeOpt, int32_t duplicatedTimeOpt,
                                  int32_t& rawoff, int32_t& dstoff, UErrorCode& ec) const {
    if (U_FAILURE(ec)) {
        return;
    }
    if (finalZone != NULL && date >= finalStartMillis) {
        finalZone->getOffsetFromLocal(date, nonExistingTimeOpt, duplicatedTimeOpt, rawoff, dstoff, ec);
    } else {
        getHistoricalOffset(date, TRUE, nonExistingTimeOpt, duplicatedTimeOpt, rawoff, dstoff);
    }
}